

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O1

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_visitVarType<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *varType)

{
  DataLocation *loc;
  DataType *dt;
  mapped_type *pmVar1;
  const_iterator locIt;
  sockaddr *__addr;
  uint uVar2;
  mapped_type mVar3;
  anon_class_16_2_633b926d local_40;
  
  loc = &(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).super_VariantType.
         _selLoc;
  local_40.this = this;
  local_40.loc = loc;
  dt = anon_func::anon_class_16_2_633b926d::operator()(&local_40);
  locIt._M_current =
       (varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).super_VariantType._selLoc
       ._pathElems.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _setKeyDts(this,dt,loc,locIt,
             &(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).super_VariantType.
              _theSelTypes);
  if ((varType->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
      super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (varType->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
      super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = 1;
    mVar3 = 0;
    do {
      local_40.this = (SetKeyDtsDtVisitor *)varType;
      pmVar1 = std::__detail::
               _Map_base<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_current,(key_type *)&local_40);
      *pmVar1 = mVar3;
      DataType::accept(*(DataType **)
                        ((long)(varType->super_VariantWithIntegerSelectorType<unsigned_long_long>).
                               _opts.
                               super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[mVar3]._M_t.
                               super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                               ._M_t + 0x50),(int)this,__addr,(socklen_t *)locIt._M_current);
      mVar3 = (mapped_type)uVar2;
      uVar2 = uVar2 + 1;
    } while (mVar3 < (ulong)((long)(varType->
                                   super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                                   super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(varType->
                                   super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                                   super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_40.this = (SetKeyDtsDtVisitor *)varType;
  std::
  _Hashtable<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->_current)._M_h);
  return;
}

Assistant:

void _visitVarType(const VarTypeT& varType)
    {
        this->_setKeyDts(varType.selectorLocation(), TraceTypeImpl::varOptTypeSelTypes(varType));

        for (auto i = 0U; i < varType.size(); ++i) {
            // currently being visited
            _current[&varType] = i;

            varType[i].dataType().accept(*this);
        }

        // not visited anymore
        _current.erase(&varType);
    }